

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O1

string * vera::toString<double>(string *__return_storage_ptr__,double *_value)

{
  ostringstream out;
  long local_190 [3];
  uint auStack_178 [22];
  ios_base local_120 [264];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_190);
  *(uint *)((long)auStack_178 + *(long *)(local_190[0] + -0x18)) =
       *(uint *)((long)auStack_178 + *(long *)(local_190[0] + -0x18)) & 0xfffffefb | 4;
  std::ostream::_M_insert<double>(*_value);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_190);
  std::ios_base::~ios_base(local_120);
  return __return_storage_ptr__;
}

Assistant:

std::string toString(const T& _value) {
    std::ostringstream out;
    out << std::fixed << _value;
    return out.str();
}